

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.cpp
# Opt level: O3

void __thiscall
pbrt::PixelStatsAccumulator::ReportRatio
          (PixelStatsAccumulator *this,Point2i *p,int statIndex,char *name,int64_t num,int64_t denom
          )

{
  Image *this_00;
  PixelStats *pPVar1;
  pointer pbVar2;
  char *pcVar3;
  Tuple2<pbrt::Point2,_int> TVar4;
  Allocator alloc;
  ulong uVar5;
  pointer pIVar6;
  Point2i resolution;
  long lVar7;
  int iVar8;
  Point2i p_00;
  ulong uVar9;
  long *plVar10;
  Float FVar11;
  Float FVar12;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  ColorEncodingHandle local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  undefined1 *local_188 [2];
  undefined1 local_178 [16];
  long *local_168 [2];
  long local_158 [2];
  Image local_148;
  
  pPVar1 = this->stats;
  uVar9 = (ulong)statIndex;
  pIVar6 = (pPVar1->ratioImages).super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar5 = ((long)(pPVar1->ratioImages).super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pIVar6 >> 3) *
          -0x5075075075075075;
  if (uVar5 < uVar9 || uVar5 - uVar9 == 0) {
    std::vector<pbrt::Image,_std::allocator<pbrt::Image>_>::resize
              (&pPVar1->ratioImages,(long)(statIndex + 1));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::resize(&this->stats->ratioNames,(long)(statIndex + 1));
    pbVar2 = (this->stats->ratioNames).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pcVar3 = (char *)pbVar2[uVar9]._M_string_length;
    strlen(name);
    std::__cxx11::string::_M_replace((ulong)(pbVar2 + uVar9),0,pcVar3,(ulong)name);
    pIVar6 = (this->stats->ratioImages).
             super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  this_00 = pIVar6 + uVar9;
  TVar4 = pIVar6[uVar9].resolution.super_Tuple2<pbrt::Point2,_int>;
  resolution.super_Tuple2<pbrt::Point2,_int>.x = DAT_030e5078 - imageBounds;
  iVar8 = DAT_030e507c - DAT_030e5074;
  if (TVar4.y != iVar8 || TVar4.x != resolution.super_Tuple2<pbrt::Point2,_int>.x) {
    local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"numerator","");
    local_188[0] = local_178;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_188,"denominator","");
    plVar10 = local_158;
    local_168[0] = plVar10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"ratio","");
    resolution.super_Tuple2<pbrt::Point2,_int>.y = iVar8;
    local_1b0.
    super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
    .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
             )0;
    alloc.memoryResource = pstd::pmr::new_delete_resource();
    channels.n = 3;
    channels.ptr = &local_1a8;
    Image::Image(&local_148,Float,resolution,channels,&local_1b0,alloc);
    (this_00->resolution).super_Tuple2<pbrt::Point2,_int>.y =
         local_148.resolution.super_Tuple2<pbrt::Point2,_int>.y;
    this_00->format = local_148.format;
    (this_00->resolution).super_Tuple2<pbrt::Point2,_int>.x =
         local_148.resolution.super_Tuple2<pbrt::Point2,_int>.x;
    InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&this_00->channelNames,&local_148.channelNames);
    (this_00->encoding).
    super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
    .bits = (uintptr_t)
            local_148.encoding.
            super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
            .bits;
    pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::operator=
              (&this_00->p8,&local_148.p8);
    pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::operator=
              (&this_00->p16,&local_148.p16);
    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=
              (&this_00->p32,&local_148.p32);
    local_148.p32.nStored = 0;
    (*(local_148.p32.alloc.memoryResource)->_vptr_memory_resource[3])
              (local_148.p32.alloc.memoryResource,local_148.p32.ptr,local_148.p32.nAlloc << 2,4);
    local_148.p16.nStored = 0;
    (*(local_148.p16.alloc.memoryResource)->_vptr_memory_resource[3])
              (local_148.p16.alloc.memoryResource,local_148.p16.ptr,local_148.p16.nAlloc * 2,2);
    local_148.p8.nStored = 0;
    (*(local_148.p8.alloc.memoryResource)->_vptr_memory_resource[3])
              (local_148.p8.alloc.memoryResource,local_148.p8.ptr,local_148.p8.nAlloc,1);
    InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~InlinedVector(&local_148.channelNames);
    lVar7 = -0x60;
    do {
      if (plVar10 != (long *)plVar10[-2]) {
        operator_delete((long *)plVar10[-2],*plVar10 + 1);
      }
      plVar10 = plVar10 + -4;
      lVar7 = lVar7 + 0x20;
    } while (lVar7 != 0);
  }
  p_00.super_Tuple2<pbrt::Point2,_int>.x = (p->super_Tuple2<pbrt::Point2,_int>).x - imageBounds;
  p_00.super_Tuple2<pbrt::Point2,_int>.y = (p->super_Tuple2<pbrt::Point2,_int>).y - DAT_030e5074;
  FVar11 = Image::GetChannel(this_00,p_00,0,(WrapMode2D)0x200000002);
  Image::SetChannel(this_00,p_00,0,FVar11 + (float)num);
  FVar11 = Image::GetChannel(this_00,p_00,1,(WrapMode2D)0x200000002);
  Image::SetChannel(this_00,p_00,1,FVar11 + (float)denom);
  FVar11 = Image::GetChannel(this_00,p_00,0,(WrapMode2D)0x200000002);
  FVar12 = 0.0;
  if ((FVar11 != 0.0) || (NAN(FVar11))) {
    FVar12 = Image::GetChannel(this_00,p_00,0,(WrapMode2D)0x200000002);
    FVar11 = Image::GetChannel(this_00,p_00,1,(WrapMode2D)0x200000002);
    FVar12 = FVar12 / FVar11;
  }
  Image::SetChannel(this_00,p_00,2,FVar12);
  return;
}

Assistant:

void PixelStatsAccumulator::ReportRatio(const Point2i &p, int statIndex, const char *name,
                                        int64_t num, int64_t denom) {
    if (statIndex >= stats->ratioImages.size()) {
        stats->ratioImages.resize(statIndex + 1);
        stats->ratioNames.resize(statIndex + 1);
        stats->ratioNames[statIndex] = name;
    }

    Image &im = stats->ratioImages[statIndex];
    Point2i res = Point2i(imageBounds.Diagonal());
    if (im.Resolution() != res)
        im = Image(PixelFormat::Float, res, {"numerator", "denominator", "ratio"});

    Point2i pp = Point2i(p - imageBounds.pMin);
    im.SetChannel(pp, 0, im.GetChannel(pp, 0) + num);
    im.SetChannel(pp, 1, im.GetChannel(pp, 1) + denom);
    if (im.GetChannel(pp, 0) == 0)
        im.SetChannel(pp, 2, 0);
    else
        im.SetChannel(pp, 2, im.GetChannel(pp, 0) / im.GetChannel(pp, 1));
}